

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int rsa_check_context(mbedtls_rsa_context *ctx,int is_priv,int blinding_needed)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  undefined4 in_EDX;
  int in_ESI;
  mbedtls_mpi *in_RDI;
  
  sVar1._0_2_ = in_RDI->s;
  sVar1._2_2_ = in_RDI->n;
  sVar1._4_4_ = *(undefined4 *)&in_RDI->field_0xc;
  sVar4 = mbedtls_mpi_size((mbedtls_mpi *)0x866b9d);
  if ((sVar1 != sVar4) ||
     (uVar2._0_2_ = in_RDI->s, uVar2._2_2_ = in_RDI->n,
     uVar2._4_4_ = *(undefined4 *)&in_RDI->field_0xc, 0x400 < uVar2)) {
    return -0x4080;
  }
  iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX));
  if ((iVar3 < 1) || (iVar3 = mbedtls_mpi_get_bit(in_RDI + 1,0), iVar3 == 0)) {
    return -0x4080;
  }
  if ((in_ESI != 0) &&
     ((((iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar3 < 1 ||
        (iVar3 = mbedtls_mpi_get_bit(in_RDI + 4,0), iVar3 == 0)) ||
       (iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar3 < 1)) ||
      (iVar3 = mbedtls_mpi_get_bit(in_RDI + 5,0), iVar3 == 0)))) {
    return -0x4080;
  }
  iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX));
  if (iVar3 < 1) {
    return -0x4080;
  }
  if ((in_ESI != 0) &&
     ((iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar3 < 1 ||
      (iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar3 < 1)))) {
    return -0x4080;
  }
  if ((in_ESI != 0) && (iVar3 = mbedtls_mpi_cmp_int(in_RDI,CONCAT44(in_ESI,in_EDX)), iVar3 < 1)) {
    return -0x4080;
  }
  return 0;
}

Assistant:

static int rsa_check_context(mbedtls_rsa_context const *ctx, int is_priv,
                             int blinding_needed)
{
#if !defined(MBEDTLS_RSA_NO_CRT)
    /* blinding_needed is only used for NO_CRT to decide whether
     * P,Q need to be present or not. */
    ((void) blinding_needed);
#endif

    if (ctx->len != mbedtls_mpi_size(&ctx->N) ||
        ctx->len > MBEDTLS_MPI_MAX_SIZE) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /*
     * 1. Modular exponentiation needs positive, odd moduli.
     */

    /* Modular exponentiation wrt. N is always used for
     * RSA public key operations. */
    if (mbedtls_mpi_cmp_int(&ctx->N, 0) <= 0 ||
        mbedtls_mpi_get_bit(&ctx->N, 0) == 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Modular exponentiation for P and Q is only
     * used for private key operations and if CRT
     * is used. */
    if (is_priv &&
        (mbedtls_mpi_cmp_int(&ctx->P, 0) <= 0 ||
         mbedtls_mpi_get_bit(&ctx->P, 0) == 0 ||
         mbedtls_mpi_cmp_int(&ctx->Q, 0) <= 0 ||
         mbedtls_mpi_get_bit(&ctx->Q, 0) == 0)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
#endif /* !MBEDTLS_RSA_NO_CRT */

    /*
     * 2. Exponents must be positive
     */

    /* Always need E for public key operations */
    if (mbedtls_mpi_cmp_int(&ctx->E, 0) <= 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_RSA_NO_CRT)
    /* For private key operations, use D or DP & DQ
     * as (unblinded) exponents. */
    if (is_priv && mbedtls_mpi_cmp_int(&ctx->D, 0) <= 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
#else
    if (is_priv &&
        (mbedtls_mpi_cmp_int(&ctx->DP, 0) <= 0 ||
         mbedtls_mpi_cmp_int(&ctx->DQ, 0) <= 0)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Blinding shouldn't make exponents negative either,
     * so check that P, Q >= 1 if that hasn't yet been
     * done as part of 1. */
#if defined(MBEDTLS_RSA_NO_CRT)
    if (is_priv && blinding_needed &&
        (mbedtls_mpi_cmp_int(&ctx->P, 0) <= 0 ||
         mbedtls_mpi_cmp_int(&ctx->Q, 0) <= 0)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
#endif

    /* It wouldn't lead to an error if it wasn't satisfied,
     * but check for QP >= 1 nonetheless. */
#if !defined(MBEDTLS_RSA_NO_CRT)
    if (is_priv &&
        mbedtls_mpi_cmp_int(&ctx->QP, 0) <= 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
#endif

    return 0;
}